

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

Fl_Menu_Item * next_visible_or_not(Fl_Menu_Item *m)

{
  int local_1c;
  Fl_Menu_Item *pFStack_18;
  int nest;
  Fl_Menu_Item *m_local;
  
  local_1c = 0;
  pFStack_18 = m;
  do {
    if (pFStack_18->text == (char *)0x0) {
      if (local_1c == 0) {
        return pFStack_18;
      }
      local_1c = local_1c + -1;
    }
    else if ((pFStack_18->flags & 0x40U) != 0) {
      local_1c = local_1c + 1;
    }
    pFStack_18 = pFStack_18 + 1;
  } while (local_1c != 0);
  return pFStack_18;
}

Assistant:

static const Fl_Menu_Item* next_visible_or_not(const Fl_Menu_Item* m) {
  int nest = 0;
  do {
    if (!m->text) {
      if (!nest) return m;
      nest--;
    } else if (m->flags&FL_SUBMENU) {
      nest++;
    }
    m++;
  }
  while (nest);
  return m;
}